

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O1

void __thiscall
chrono::utils::ChParserOpenSim::SetExcitationFunction
          (ChParserOpenSim *this,string *name,shared_ptr<chrono::ChFunction> *modulation)

{
  long lVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  shared_ptr<chrono::ChLoadBase> force;
  undefined1 local_48 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  Report::GetForce((Report *)local_48,(string *)this);
  if ((__buckets_ptr)local_48._0_8_ != (__buckets_ptr)0x0) {
    lVar1 = __dynamic_cast(local_48._0_8_,&ChLoadBase::typeinfo,&ChLoadBodyForce::typeinfo,0);
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar2 = 0;
    if ((lVar1 != 0) &&
       (this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_, lVar2 = lVar1,
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
      }
    }
    if (lVar2 == 0) {
      if ((__buckets_ptr)local_48._0_8_ == (__buckets_ptr)0x0) {
        lVar2 = 0;
      }
      else {
        lVar2 = __dynamic_cast(local_48._0_8_,&ChLoadBase::typeinfo,&ChLoadBodyBodyTorque::typeinfo,
                               0);
      }
      if (lVar2 == 0) {
        lVar2 = 0;
        this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
          }
        }
      }
      if (lVar2 != 0) {
        local_48._16_8_ =
             (modulation->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        ;
        local_48._24_8_ =
             (modulation->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._24_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._24_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._24_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._24_8_)->_M_use_count + 1
            ;
          }
        }
        *(undefined8 *)(lVar2 + 0x3b8) = local_48._16_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar2 + 0x3c0),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x18));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._24_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._24_8_);
        }
      }
    }
    else {
      local_48._32_8_ =
           (modulation->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_20._M_pi =
           (modulation->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
        }
      }
      *(undefined8 *)(lVar2 + 0x98) = local_48._32_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar2 + 0xa0),&local_20);
      this_01._M_pi = local_20._M_pi;
    }
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  return;
}

Assistant:

void ChParserOpenSim::SetExcitationFunction(const std::string& name, std::shared_ptr<ChFunction> modulation) {
    // Get the force element from the report object
    auto force = m_report.GetForce(name);
    if (!force)
        return;

    if (auto b_force = std::dynamic_pointer_cast<ChLoadBodyForce>(force)) {
        b_force->SetModulationFunction(modulation);
    } else if (auto bb_torque = std::dynamic_pointer_cast<ChLoadBodyBodyTorque>(force)) {
        bb_torque->SetModulationFunction(modulation);
    }
}